

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::Diagnostic>::emplace_back<slang::Diagnostic>
          (SmallVectorBase<slang::Diagnostic> *this,Diagnostic *args)

{
  iterator pDVar1;
  Diagnostic *args_local;
  SmallVectorBase<slang::Diagnostic> *this_local;
  
  if (this->len == this->cap) {
    pDVar1 = end(this);
    this_local = (SmallVectorBase<slang::Diagnostic> *)
                 emplaceRealloc<slang::Diagnostic>(this,pDVar1,args);
  }
  else {
    pDVar1 = end(this);
    Diagnostic::Diagnostic(pDVar1,args);
    this->len = this->len + 1;
    this_local = (SmallVectorBase<slang::Diagnostic> *)back(this);
  }
  return (reference)this_local;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }